

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O3

bool CADFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"###Panel Added","");
  bVar1 = find_str_in_buf(&local_38,buf);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"C_PIN","");
    bVar1 = find_str_in_buf(&local_58,buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool CADFile::verifyFormat(std::vector<char> &buf) {
	return (find_str_in_buf("###Panel Added", buf) && find_str_in_buf("C_PIN", buf));
}